

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O3

int dwarf_highpc_b(Dwarf_Die die,Dwarf_Addr *return_value,Dwarf_Half *return_form,
                  Dwarf_Form_Class *return_class,Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict pDVar1;
  int iVar2;
  Dwarf_Bool DVar3;
  char *msg;
  Dwarf_Signed DVar4;
  long lVar5;
  Dwarf_Small *pDVar6;
  Dwarf_Debug dbg;
  Dwarf_Half attr_form;
  Dwarf_Addr _ltmp;
  Dwarf_Unsigned index_to_addr;
  Dwarf_Byte_Ptr info_ptr;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  Dwarf_Half local_7c;
  Dwarf_Half local_7a;
  Dwarf_Small *local_78;
  Dwarf_Addr local_70;
  Dwarf_Byte_Ptr local_68;
  Dwarf_Form_Class local_5c;
  Dwarf_Small *local_58;
  Dwarf_Byte_Ptr local_50;
  ulong local_48;
  Dwarf_Unsigned local_40 [2];
  
  local_50 = (Dwarf_Small *)0x0;
  local_7c = 0;
  if (die == (Dwarf_Die)0x0) {
    DVar4 = 0x34;
  }
  else {
    pDVar1 = die->di_cu_context;
    if (pDVar1 != (Dwarf_CU_Context_conflict)0x0) {
      dbg = pDVar1->cc_dbg;
      if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
        msg = 
        "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
        ;
        DVar4 = 0x51;
        dbg = (Dwarf_Debug)0x0;
LAB_0017d613:
        _dwarf_error_string(dbg,error,DVar4,msg);
        return 1;
      }
      local_48 = (ulong)pDVar1->cc_address_size;
      iVar2 = _dwarf_get_value_ptr(die,0x12,&local_7c,&local_50,(Dwarf_Signed *)0x0,error);
      if (iVar2 == -1) {
        return -1;
      }
      if (iVar2 == 1) {
        return 1;
      }
      pDVar1 = die->di_cu_context;
      lVar5 = 0x138;
      if (pDVar1->cc_is_info == 0) {
        lVar5 = 0x200;
      }
      local_58 = (Dwarf_Small *)
                 ((ulong)pDVar1->cc_extension_size + (ulong)pDVar1->cc_length_size +
                 *(long *)((long)&pDVar1->cc_dbg->de_magic + lVar5) + pDVar1->cc_debug_offset +
                 pDVar1->cc_length);
      local_7a = local_7c;
      local_78 = (Dwarf_Small *)CONCAT44(local_78._4_4_,(uint)local_7c);
      local_5c = dwarf_get_form_class
                           (pDVar1->cc_version_stamp,0x12,(ushort)pDVar1->cc_length_size,local_7c);
      if (local_5c == DW_FORM_CLASS_ADDRESS) {
        DVar3 = dwarf_addr_form_is_indexed((int)local_78);
        pDVar6 = local_50;
        if (DVar3 != 0) {
          local_68 = (Dwarf_Byte_Ptr)0x0;
          pDVar1 = die->di_cu_context;
          iVar2 = (int)local_78;
          local_78 = local_50;
          iVar2 = _dwarf_get_addr_index_itself
                            (iVar2,local_50,dbg,pDVar1,(Dwarf_Unsigned *)&local_68,error);
          if (iVar2 != 0) {
            return iVar2;
          }
          iVar2 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,pDVar1,(Dwarf_Unsigned)local_68,&local_70,error);
          pDVar6 = local_78;
          if (iVar2 != 0) {
            return iVar2;
          }
        }
        local_70 = 0;
        if (local_58 < pDVar6 + local_48) {
          msg = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
          DVar4 = 0x14b;
          goto LAB_0017d613;
        }
        (*dbg->de_copy_word)(&local_70,pDVar6,local_48);
      }
      else {
        local_70 = 0;
        iVar2 = _dwarf_die_attr_unsigned_constant(die,0x12,&local_70,error);
        if (iVar2 != 0) {
          local_68 = (Dwarf_Byte_Ptr)0x0;
          iVar2 = _dwarf_get_value_ptr(die,0x12,&local_7c,&local_68,(Dwarf_Signed *)0x0,error);
          if (iVar2 == -1) {
            return -1;
          }
          if (iVar2 == 1) {
            return 1;
          }
          if (local_7c == 0xd) {
            local_40[1] = 0;
            local_40[0] = 0;
            iVar2 = dwarf_decode_leb128((char *)local_68,local_40 + 1,local_40,(char *)local_58);
            if (iVar2 == 1) {
              msg = "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c";
              DVar4 = 0x149;
              goto LAB_0017d613;
            }
            *return_value = local_40[0];
            local_7a = 0xd;
            goto LAB_0017d6ea;
          }
          DVar4 = 0x18d;
          goto LAB_0017d624;
        }
      }
      *return_value = local_70;
LAB_0017d6ea:
      if (return_form != (Dwarf_Half *)0x0) {
        *return_form = local_7a;
      }
      if (return_class != (Dwarf_Form_Class *)0x0) {
        *return_class = local_5c;
        return 0;
      }
      return 0;
    }
    DVar4 = 0x68;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_0017d624:
  _dwarf_error(dbg,error,DVar4);
  return 1;
}

Assistant:

int
dwarf_highpc_b(Dwarf_Die die,
    Dwarf_Addr *return_value,
    Dwarf_Half *return_form,
    enum Dwarf_Form_Class *return_class,
    Dwarf_Error *error)
{
    Dwarf_Byte_Ptr info_ptr = 0;
    Dwarf_Half attr_form = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Half address_size = 0;
    Dwarf_Half offset_size = 0;
    enum Dwarf_Form_Class class = DW_FORM_CLASS_UNKNOWN;
    Dwarf_Half version = 0;
    Dwarf_Byte_Ptr die_info_end = 0;
    int res = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    dbg = die->di_cu_context->cc_dbg;
    address_size = die->di_cu_context->cc_address_size;

    res = _dwarf_get_value_ptr(die, DW_AT_high_pc,
        &attr_form,&info_ptr,0,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    die_info_end = _dwarf_calculate_info_section_end_ptr(
        die->di_cu_context);

    version = die->di_cu_context->cc_version_stamp;
    offset_size = die->di_cu_context->cc_length_size;
    class = dwarf_get_form_class(version,DW_AT_high_pc,
        offset_size,attr_form);

    if (class == DW_FORM_CLASS_ADDRESS) {
        Dwarf_Addr addr = 0;
        if (dwarf_addr_form_is_indexed(attr_form)) {
            Dwarf_Unsigned addr_out = 0;
            Dwarf_Unsigned index_to_addr = 0;
            int res2 = 0;
            Dwarf_CU_Context context = die->di_cu_context;

            /*  index_to_addr we get here might apply
                to this dbg or to tieddbg. */
            /* error is returned on dbg, not tied */
            res2 = _dwarf_get_addr_index_itself(attr_form,
                info_ptr,dbg,context,&index_to_addr,error);
            if (res2 != DW_DLV_OK) {
                return res2;
            }
            res2= _dwarf_look_in_local_and_tied_by_index(dbg,
                context,
                index_to_addr,
                &addr_out,
                error);
            if (res2 != DW_DLV_OK) {
                return res2;
            }
        }
        READ_UNALIGNED_CK(dbg, addr, Dwarf_Addr,
            info_ptr, address_size,
            error,die_info_end);
        *return_value = addr;
    } else {
        int res3 = 0;
        Dwarf_Unsigned v = 0;
        res3 = _dwarf_die_attr_unsigned_constant(die,DW_AT_high_pc,
            &v,error);
        if (res3 != DW_DLV_OK) {
            Dwarf_Byte_Ptr info_ptr2 = 0;

            res3 = _dwarf_get_value_ptr(die, DW_AT_high_pc,
                &attr_form,&info_ptr2,0,error);
            if (res3 == DW_DLV_ERROR) {
                return res3;
            }
            if (res3 == DW_DLV_NO_ENTRY) {
                return res3;
            }
            if (attr_form == DW_FORM_sdata) {
                Dwarf_Signed sval = 0;

                /*  DWARF4 defines the value as an unsigned offset
                    in section 2.17.2. */
                DECODE_LEB128_UWORD_CK(info_ptr2, sval,
                    dbg,error,die_info_end);
                *return_value = (Dwarf_Unsigned)sval;
            } else {
                _dwarf_error(dbg, error, DW_DLE_HIGHPC_WRONG_FORM);
                return DW_DLV_ERROR;
            }
        } else {
            *return_value = v;
        }
    }
    /*  Allow null args starting 22 April 2019. */
    if (return_form) {
        *return_form = attr_form;
    }
    if (return_class) {
        *return_class = class;
    }
    return DW_DLV_OK;
}